

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

EExpr * __thiscall
mp::QP2PassVisitor::GetPass2Result(EExpr *__return_storage_ptr__,QP2PassVisitor *this)

{
  double dVar1;
  int v;
  ptr piVar2;
  size_ty sVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  size_t j;
  long lVar9;
  ulong uVar10;
  
  this->pass_ = 0;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (&__return_storage_ptr__->super_QuadraticExpr);
  (__return_storage_ptr__->super_QuadraticExpr).constant_term_ = (double)this->const_term_;
  LinTerms::reserve((LinTerms *)__return_storage_ptr__,
                    (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_size);
  piVar2 = (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  sVar3 = (this->vars_lin_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  for (lVar9 = 0; sVar3 << 2 != lVar9; lVar9 = lVar9 + 4) {
    v = *(int *)((long)piVar2 + lVar9);
    dVar1 = (this->coefs_lin_dense_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[v];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      LinTerms::add_term((LinTerms *)__return_storage_ptr__,dVar1,v);
    }
  }
  uVar4 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  for (uVar7 = 0; uVar10 = uVar7, uVar7 < uVar4; uVar7 = uVar7 + 1) {
    for (; uVar10 < uVar4; uVar10 = uVar10 + 1) {
      uVar8 = (uint)uVar10;
      uVar6 = (uint)uVar7;
      uVar5 = uVar6;
      if (uVar8 < uVar6) {
        uVar5 = uVar8;
      }
      if (uVar6 < uVar8) {
        uVar6 = uVar8;
      }
      dVar1 = (this->coefs_qp_).matrix.super_small_vector_base<std::allocator<double>,_136U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr
              [((uVar6 + 1) * uVar6 >> 1) + uVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        piVar2 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
        QuadTerms::add_term(&(__return_storage_ptr__->super_QuadraticExpr).super_QuadAndLinTerms.
                             super_QuadTerms,dVar1,piVar2[uVar7],piVar2[uVar10]);
        uVar4 = (this->vars_qp_).super_small_vector_base<std::allocator<int>,_64U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_size;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EExpr QP2PassVisitor::GetPass2Result() {
  assert(2==pass_);
  pass_ = 0;          // to indicate the run is finished
  EExpr result;
  result.constant_term(const_term_);
  result.GetLinTerms().reserve(vars_lin_.size());
  for (auto vl: vars_lin_)
    if (auto c = coefs_lin_dense_[vl])
      result.GetLinTerms().add_term(c, vl);
  assert(result.GetLinTerms().is_sorted());
  for (std::size_t i=0; i<vars_qp_.size(); ++i)
    for (std::size_t j=i; j<vars_qp_.size(); ++j)
      if (auto c = coefs_qp_(i, j))
        result.GetQPTerms().add_term(
            c, vars_qp_[i], vars_qp_[j]);
  assert(result.GetQPTerms().is_sorted());
  return result;
}